

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O2

string * __thiscall
HighFreqPub::getAddress_abi_cxx11_(string *__return_storage_ptr__,HighFreqPub *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  return __return_storage_ptr__;
}

Assistant:

std::string HighFreqPub::getAddress() const{
    return sockEndpoint;
}